

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__de_iphone(stbi__png *z)

{
  byte bVar1;
  byte bVar2;
  int *piVar3;
  byte bVar4;
  uint uVar5;
  undefined8 *in_RDI;
  long *in_FS_OFFSET;
  stbi_uc t_2;
  stbi_uc half;
  stbi_uc t_1;
  stbi_uc a;
  stbi_uc t;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  stbi__context *s;
  int local_2c;
  byte *local_20;
  uint local_14;
  
  piVar3 = (int *)*in_RDI;
  uVar5 = *piVar3 * piVar3[1];
  local_20 = (byte *)in_RDI[3];
  if (piVar3[3] == 3) {
    for (local_14 = 0; local_14 < uVar5; local_14 = local_14 + 1) {
      bVar1 = *local_20;
      *local_20 = local_20[2];
      local_20[2] = bVar1;
      local_20 = local_20 + 3;
    }
  }
  else {
    if (*(int *)(*in_FS_OFFSET + -0xc) == 0) {
      local_2c = stbi__unpremultiply_on_load_global;
    }
    else {
      local_2c = *(int *)(*in_FS_OFFSET + -0x10);
    }
    if (local_2c == 0) {
      for (local_14 = 0; local_14 < uVar5; local_14 = local_14 + 1) {
        bVar1 = *local_20;
        *local_20 = local_20[2];
        local_20[2] = bVar1;
        local_20 = local_20 + 4;
      }
    }
    else {
      for (local_14 = 0; local_14 < uVar5; local_14 = local_14 + 1) {
        bVar1 = local_20[3];
        bVar2 = *local_20;
        if (bVar1 == 0) {
          *local_20 = local_20[2];
          local_20[2] = bVar2;
        }
        else {
          bVar4 = bVar1 / 2;
          *local_20 = (byte)((ulong)((uint)local_20[2] * 0xff + (uint)bVar4) /
                            (ulong)(long)(int)(uint)bVar1);
          local_20[1] = (byte)((ulong)((uint)local_20[1] * 0xff + (uint)bVar4) /
                              (ulong)(long)(int)(uint)bVar1);
          local_20[2] = (byte)((ulong)((uint)bVar2 * 0xff + (uint)bVar4) /
                              (ulong)(long)(int)(uint)bVar1);
        }
        local_20 = local_20 + 4;
      }
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               stbi_uc half = a / 2;
               p[0] = (p[2] * 255 + half) / a;
               p[1] = (p[1] * 255 + half) / a;
               p[2] = ( t   * 255 + half) / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}